

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportInstallFileGenerator::GenerateImportPrefix(cmExportInstallFileGenerator *this,ostream *os)

{
  cmMakefile *this_00;
  bool bVar1;
  string *psVar2;
  ostream *poVar3;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string absDestS;
  string absDest;
  string dest;
  string installPrefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  this_00 = this->IEGen->LocalGenerator->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"CMAKE_INSTALL_PREFIX",(allocator<char> *)&local_c0);
  psVar2 = cmMakefile::GetSafeDefinition(this_00,&local_a0);
  std::__cxx11::string::string((string *)&local_60,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_a0);
  psVar2 = &(this->IEGen->super_cmInstallGenerator).Destination;
  bVar1 = cmsys::SystemTools::FileIsFullPath(psVar2);
  if (bVar1) {
    poVar3 = std::operator<<(os,
                             "# The installation prefix configured by this project.\nset(_IMPORT_PREFIX \""
                            );
    poVar3 = std::operator<<(poVar3,(string *)&local_60);
    std::operator<<(poVar3,"\")\n\n");
    goto LAB_00589a47;
  }
  std::operator+(&local_c0,&local_60,"/");
  std::operator+(&local_a0,&local_c0,psVar2);
  std::__cxx11::string::~string((string *)&local_c0);
  std::operator+(&local_c0,&local_a0,"/");
  poVar3 = std::operator<<(os,"# Compute the installation prefix relative to this file.\n");
  poVar3 = std::operator<<(poVar3,"get_filename_component(_IMPORT_PREFIX");
  std::operator<<(poVar3," \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n");
  str._M_str = local_c0._M_dataplus._M_p;
  str._M_len = local_c0._M_string_length;
  bVar1 = cmHasLiteralPrefix<6ul>(str,(char (*) [6])0x7e9943);
  if (bVar1) {
LAB_00589952:
    poVar3 = std::operator<<(os,
                             "# Use original install prefix when loaded through a\n# cross-prefix symbolic link such as /lib -> /usr/lib.\nget_filename_component(_realCurr \"${_IMPORT_PREFIX}\" REALPATH)\nget_filename_component(_realOrig \""
                            );
    poVar3 = std::operator<<(poVar3,(string *)&local_a0);
    poVar3 = std::operator<<(poVar3,
                             "\" REALPATH)\nif(_realCurr STREQUAL _realOrig)\n  set(_IMPORT_PREFIX \""
                            );
    poVar3 = std::operator<<(poVar3,(string *)&local_a0);
    std::operator<<(poVar3,"\")\nendif()\nunset(_realOrig)\nunset(_realCurr)\n");
  }
  else {
    str_00._M_str = local_c0._M_dataplus._M_p;
    str_00._M_len = local_c0._M_string_length;
    bVar1 = cmHasLiteralPrefix<8ul>(str_00,(char (*) [8])0x7eaa81);
    if (bVar1) goto LAB_00589952;
    str_01._M_str = local_c0._M_dataplus._M_p;
    str_01._M_len = local_c0._M_string_length;
    bVar1 = cmHasLiteralPrefix<9ul>(str_01,(char (*) [9])0x7eaa8d);
    if (bVar1) goto LAB_00589952;
    str_02._M_str = local_c0._M_dataplus._M_p;
    str_02._M_len = local_c0._M_string_length;
    bVar1 = cmHasLiteralPrefix<10ul>(str_02,(char (*) [10])"/usr/lib/");
    if (bVar1) goto LAB_00589952;
    str_03._M_str = local_c0._M_dataplus._M_p;
    str_03._M_len = local_c0._M_string_length;
    bVar1 = cmHasLiteralPrefix<12ul>(str_03,(char (*) [12])"/usr/lib64/");
    if (bVar1) goto LAB_00589952;
    str_04._M_str = local_c0._M_dataplus._M_p;
    str_04._M_len = local_c0._M_string_length;
    bVar1 = cmHasLiteralPrefix<13ul>(str_04,(char (*) [13])"/usr/libx32/");
    if (bVar1) goto LAB_00589952;
  }
  std::__cxx11::string::string((string *)&local_80,(string *)psVar2);
  while (local_80._M_string_length != 0) {
    std::operator<<(os,"get_filename_component(_IMPORT_PREFIX \"${_IMPORT_PREFIX}\" PATH)\n");
    cmsys::SystemTools::GetFilenamePath(&local_40,&local_80);
    std::__cxx11::string::operator=((string *)&local_80,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  poVar3 = std::operator<<(os,"if(_IMPORT_PREFIX STREQUAL \"/\")\n");
  poVar3 = std::operator<<(poVar3,"  set(_IMPORT_PREFIX \"\")\n");
  poVar3 = std::operator<<(poVar3,"endif()\n");
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
LAB_00589a47:
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void cmExportInstallFileGenerator::GenerateImportPrefix(std::ostream& os)
{
  // Set an _IMPORT_PREFIX variable for import location properties
  // to reference if they are relative to the install prefix.
  std::string installPrefix =
    this->IEGen->GetLocalGenerator()->GetMakefile()->GetSafeDefinition(
      "CMAKE_INSTALL_PREFIX");
  std::string const& expDest = this->IEGen->GetDestination();
  if (cmSystemTools::FileIsFullPath(expDest)) {
    // The export file is being installed to an absolute path so the
    // package is not relocatable.  Use the configured install prefix.
    /* clang-format off */
    os <<
      "# The installation prefix configured by this project.\n"
      "set(_IMPORT_PREFIX \"" << installPrefix << "\")\n"
      "\n";
    /* clang-format on */
  } else {
    // Add code to compute the installation prefix relative to the
    // import file location.
    std::string absDest = installPrefix + "/" + expDest;
    std::string absDestS = absDest + "/";
    os << "# Compute the installation prefix relative to this file.\n"
       << "get_filename_component(_IMPORT_PREFIX"
       << " \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n";
    if (cmHasLiteralPrefix(absDestS, "/lib/") ||
        cmHasLiteralPrefix(absDestS, "/lib64/") ||
        cmHasLiteralPrefix(absDestS, "/libx32/") ||
        cmHasLiteralPrefix(absDestS, "/usr/lib/") ||
        cmHasLiteralPrefix(absDestS, "/usr/lib64/") ||
        cmHasLiteralPrefix(absDestS, "/usr/libx32/")) {
      // Handle "/usr move" symlinks created by some Linux distros.
      /* clang-format off */
      os <<
        "# Use original install prefix when loaded through a\n"
        "# cross-prefix symbolic link such as /lib -> /usr/lib.\n"
        "get_filename_component(_realCurr \"${_IMPORT_PREFIX}\" REALPATH)\n"
        "get_filename_component(_realOrig \"" << absDest << "\" REALPATH)\n"
        "if(_realCurr STREQUAL _realOrig)\n"
        "  set(_IMPORT_PREFIX \"" << absDest << "\")\n"
        "endif()\n"
        "unset(_realOrig)\n"
        "unset(_realCurr)\n";
      /* clang-format on */
    }
    std::string dest = expDest;
    while (!dest.empty()) {
      os << "get_filename_component(_IMPORT_PREFIX \"${_IMPORT_PREFIX}\" "
            "PATH)\n";
      dest = cmSystemTools::GetFilenamePath(dest);
    }
    os << "if(_IMPORT_PREFIX STREQUAL \"/\")\n"
       << "  set(_IMPORT_PREFIX \"\")\n"
       << "endif()\n"
       << "\n";
  }
}